

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::FindIndependentGroups(wasm::InsertOrderedSet<CFG::
Block*>&,wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>&,wasm::
InsertOrderedSet<CFG::Block*>*)::HelperClass::InvalidateWithChildren(CFG::Block__
          (void *this,Block *New)

{
  long lVar1;
  Block *pBVar2;
  Block *pBVar3;
  BlockBranchMap *pBVar4;
  _List_node_base *p_Var5;
  mapped_type *ppBVar6;
  size_type sVar7;
  InsertOrderedSet<CFG::Block_*> *this_00;
  long lVar8;
  _List_node_base *p_Var9;
  long lVar10;
  bool bVar11;
  key_type local_60;
  Block *Invalidatee;
  Block *Owner;
  BlockList ToInvalidate;
  
  Owner = (Block *)&Owner;
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)Owner;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)New;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       (_List_node_base *)
       ((long)&(ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                _M_node.super__List_node_base._M_prev)->_M_next + 1);
  if (ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
      super__List_node_base._M_prev != (_List_node_base *)0x0) {
    ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
    _M_size = (long)this + 8;
    lVar1 = (long)this + 0x10;
    do {
      pBVar3 = Owner;
      local_60 = (key_type)(Owner->BranchesOut).Map._M_h._M_bucket_count;
      ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
      super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                   _M_impl._M_node.super__List_node_base._M_prev[-1]._M_prev + 7);
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(pBVar3,0x18);
      ppBVar6 = std::
                map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                              *)ToInvalidate.
                                super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                                _M_impl._M_node._M_size,&local_60);
      Invalidatee = *ppBVar6;
      sVar7 = std::
              _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(*this,&Invalidatee);
      if (sVar7 != 0) {
        this_00 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
                  operator[](*this,&Invalidatee);
        ::wasm::InsertOrderedSet<CFG::Block_*>::erase(this_00,&local_60);
      }
      ppBVar6 = std::
                map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                              *)ToInvalidate.
                                super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                                _M_impl._M_node._M_size,&local_60);
      if (*ppBVar6 != (mapped_type)0x0) {
        ppBVar6 = std::
                  map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                  ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                *)ToInvalidate.
                                  super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>.
                                  _M_impl._M_node._M_size,&local_60);
        *ppBVar6 = (mapped_type)0x0;
        pBVar4 = &local_60->BranchesOut;
        for (p_Var5 = (local_60->BranchesOut).List.
                      super__List_base<std::pair<CFG::Block_*const,_CFG::Branch_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            p_Var5 != (_List_node_base *)&pBVar4->List; p_Var5 = p_Var5->_M_next) {
          lVar10 = *(long *)((long)this + 0x18);
          lVar8 = lVar1;
          if (lVar10 != 0) {
            do {
              bVar11 = *(_List_node_base **)(lVar10 + 0x20) < p_Var5[1]._M_next;
              if (!bVar11) {
                lVar8 = lVar10;
              }
              lVar10 = *(long *)(lVar10 + 0x10 + (ulong)bVar11 * 8);
            } while (lVar10 != 0);
          }
          lVar10 = lVar1;
          if ((lVar8 != lVar1) &&
             (lVar10 = lVar8, p_Var5[1]._M_next < *(_List_node_base **)(lVar8 + 0x20))) {
            lVar10 = lVar1;
          }
          if ((lVar10 != lVar1) && (*(long *)(lVar10 + 0x28) != 0)) {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var5[1]._M_next;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
            _M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&(ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>
                          ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
          }
        }
      }
    } while (ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
             _M_node.super__List_node_base._M_prev != (_List_node_base *)0x0);
  }
  pBVar3 = Owner;
  while (pBVar3 != (Block *)&Owner) {
    pBVar2 = (Block *)pBVar3->relooper;
    operator_delete(pBVar3,0x18);
    pBVar3 = pBVar2;
  }
  return;
}

Assistant:

void InvalidateWithChildren(Block* New) { // TODO: rename New
          // Being in the list means you need to be invalidated
          BlockList ToInvalidate;
          ToInvalidate.push_back(New);
          while (ToInvalidate.size() > 0) {
            Block* Invalidatee = ToInvalidate.front();
            ToInvalidate.pop_front();
            Block* Owner = Ownership[Invalidatee];
            // Owner may have been invalidated, do not add to IndependentGroups!
            if (contains(IndependentGroups, Owner)) {
              IndependentGroups[Owner].erase(Invalidatee);
            }
            // may have been seen before and invalidated already
            if (Ownership[Invalidatee]) {
              Ownership[Invalidatee] = nullptr;
              for (auto& [Target, _] : Invalidatee->BranchesOut) {
                auto Known = Ownership.find(Target);
                if (Known != Ownership.end()) {
                  Block* TargetOwner = Known->second;
                  if (TargetOwner) {
                    ToInvalidate.push_back(Target);
                  }
                }
              }
            }
          }
        }